

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  BYTE **ppBVar1;
  U32 *pUVar2;
  unsigned_long_long uVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  bool bVar7;
  U32 UVar8;
  int iVar9;
  int iVar10;
  U32 UVar11;
  uint uVar12;
  size_t sVar13;
  size_t sVar14;
  ulong uVar15;
  size_t sVar16;
  int iVar17;
  long lVar18;
  uint uVar19;
  size_t sVar20;
  ZSTD_CCtx_params *pZVar21;
  undefined8 *puVar22;
  ushort uVar23;
  BYTE *ip;
  ZSTD_CCtx_params in_stack_fffffffffffffef8;
  short *local_78;
  short *local_70;
  size_t local_68;
  
  if (cctx->stage == ZSTDcs_created) {
    sVar16 = 0xffffffffffffffc4;
  }
  else {
    if (cctx->stage == ZSTDcs_init && frame != 0) {
      uVar3 = cctx->pledgedSrcSizePlusOne;
      UVar11 = cctx->dictID;
      pZVar21 = &cctx->appliedParams;
      puVar22 = (undefined8 *)&stack0xfffffffffffffef8;
      for (lVar18 = 0x10; lVar18 != 0; lVar18 = lVar18 + -1) {
        *puVar22 = *(undefined8 *)pZVar21;
        pZVar21 = (ZSTD_CCtx_params *)&(pZVar21->cParams).chainLog;
        puVar22 = puVar22 + 1;
      }
      sVar13 = ZSTD_writeFrameHeader(dst,dstCapacity,in_stack_fffffffffffffef8,uVar3 - 1,UVar11);
      if (0xffffffffffffff88 < sVar13) {
        return sVar13;
      }
      dstCapacity = dstCapacity - sVar13;
      local_70 = (short *)((long)dst + sVar13);
      cctx->stage = ZSTDcs_ongoing;
    }
    else {
      sVar13 = 0;
      local_70 = (short *)dst;
    }
    sVar16 = sVar13;
    if (srcSize != 0) {
      pBVar4 = (cctx->blockState).matchState.window.nextSrc;
      if (pBVar4 != (BYTE *)src) {
        pBVar5 = (cctx->blockState).matchState.window.base;
        lVar18 = (long)pBVar4 - (long)pBVar5;
        UVar11 = (cctx->blockState).matchState.window.dictLimit;
        (cctx->blockState).matchState.window.lowLimit = UVar11;
        UVar8 = (U32)lVar18;
        (cctx->blockState).matchState.window.dictLimit = UVar8;
        (cctx->blockState).matchState.window.dictBase = pBVar5;
        (cctx->blockState).matchState.window.base = (BYTE *)((long)src - lVar18);
        if (UVar8 - UVar11 < 8) {
          (cctx->blockState).matchState.window.lowLimit = UVar8;
        }
      }
      pBVar5 = (BYTE *)((long)src + srcSize);
      (cctx->blockState).matchState.window.nextSrc = pBVar5;
      pBVar6 = (cctx->blockState).matchState.window.dictBase;
      uVar12 = (cctx->blockState).matchState.window.dictLimit;
      if (src < pBVar6 + uVar12 && pBVar6 + (cctx->blockState).matchState.window.lowLimit < pBVar5)
      {
        uVar19 = (uint)((long)pBVar5 - (long)pBVar6);
        if ((long)(ulong)uVar12 < (long)pBVar5 - (long)pBVar6) {
          uVar19 = uVar12;
        }
        (cctx->blockState).matchState.window.lowLimit = uVar19;
      }
      if (pBVar4 != (BYTE *)src) {
        (cctx->blockState).matchState.nextToUpdate = (cctx->blockState).matchState.window.dictLimit;
      }
      if ((cctx->appliedParams).ldmParams.enableLdm != 0) {
        pBVar4 = (cctx->ldmState).window.nextSrc;
        if (pBVar4 != (BYTE *)src) {
          pBVar6 = (cctx->ldmState).window.base;
          lVar18 = (long)pBVar4 - (long)pBVar6;
          UVar11 = (cctx->ldmState).window.dictLimit;
          (cctx->ldmState).window.lowLimit = UVar11;
          UVar8 = (U32)lVar18;
          (cctx->ldmState).window.dictLimit = UVar8;
          (cctx->ldmState).window.dictBase = pBVar6;
          (cctx->ldmState).window.base = (BYTE *)((long)src - lVar18);
          if (UVar8 - UVar11 < 8) {
            (cctx->ldmState).window.lowLimit = UVar8;
          }
        }
        (cctx->ldmState).window.nextSrc = pBVar5;
        pBVar4 = (cctx->ldmState).window.dictBase;
        uVar12 = (cctx->ldmState).window.dictLimit;
        if (src < pBVar4 + uVar12 && pBVar4 + (cctx->ldmState).window.lowLimit < pBVar5) {
          uVar19 = (uint)((long)pBVar5 - (long)pBVar4);
          if ((long)(ulong)uVar12 < (long)pBVar5 - (long)pBVar4) {
            uVar19 = uVar12;
          }
          (cctx->ldmState).window.lowLimit = uVar19;
        }
      }
      if (frame == 0) {
        pBVar4 = (cctx->blockState).matchState.window.base;
        iVar9 = (int)pBVar4;
        if (0xe0000000 < (uint)((int)pBVar5 - iVar9)) {
          uVar12 = (int)src - iVar9;
          uVar19 = (uVar12 + (-1 << ((byte)(cctx->appliedParams).cParams.windowLog & 0x1f))) -
                   (~(-1 << ((char)(cctx->appliedParams).cParams.chainLog -
                             (ZSTD_lazy2 < (cctx->appliedParams).cParams.strategy) & 0x1fU)) &
                   uVar12);
          (cctx->blockState).matchState.window.base = pBVar4 + uVar19;
          ppBVar1 = &(cctx->blockState).matchState.window.dictBase;
          *ppBVar1 = *ppBVar1 + uVar19;
          pUVar2 = &(cctx->blockState).matchState.window.lowLimit;
          *pUVar2 = *pUVar2 - uVar19;
          pUVar2 = &(cctx->blockState).matchState.window.dictLimit;
          *pUVar2 = *pUVar2 - uVar19;
          ZSTD_reduceIndex(cctx,uVar19);
          uVar12 = (cctx->blockState).matchState.nextToUpdate;
          UVar11 = uVar12 - uVar19;
          if (uVar12 < uVar19) {
            UVar11 = 0;
          }
          (cctx->blockState).matchState.nextToUpdate = UVar11;
          (cctx->blockState).matchState.loadedDictEnd = 0;
          (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
        }
        local_68 = ZSTD_compressBlock_internal(cctx,local_70,dstCapacity,src,srcSize);
      }
      else {
        iVar9 = 1 << ((byte)(cctx->appliedParams).cParams.windowLog & 0x1f);
        sVar16 = cctx->blockSize;
        if ((cctx->appliedParams).fParams.checksumFlag != 0) {
          XXH64_update(&cctx->xxhState,src,srcSize);
        }
        local_78 = local_70;
        sVar20 = srcSize;
        do {
          if (sVar20 == 0) {
            if ((lastFrameChunk != 0) && (local_70 < local_78)) {
              cctx->stage = ZSTDcs_ending;
            }
            local_68 = (long)local_78 - (long)local_70;
            break;
          }
          bVar7 = false;
          uVar23 = (ushort)lastFrameChunk & 1;
          if (sVar16 < sVar20) {
            uVar23 = 0;
          }
          if (dstCapacity < 6) {
            local_68 = 0xffffffffffffffba;
          }
          else {
            if (sVar20 < sVar16) {
              sVar16 = sVar20;
            }
            pBVar4 = (cctx->blockState).matchState.window.base;
            iVar10 = (int)pBVar4;
            iVar17 = (int)(void *)((long)src + sVar16);
            if (0xe0000000 < (uint)(iVar17 - iVar10)) {
              uVar19 = (int)src - iVar10;
              uVar19 = uVar19 - ((~(-1 << ((char)(cctx->appliedParams).cParams.chainLog -
                                           (ZSTD_lazy2 < (cctx->appliedParams).cParams.strategy) &
                                          0x1fU)) & uVar19) + iVar9);
              (cctx->blockState).matchState.window.base = pBVar4 + uVar19;
              ppBVar1 = &(cctx->blockState).matchState.window.dictBase;
              *ppBVar1 = *ppBVar1 + uVar19;
              pUVar2 = &(cctx->blockState).matchState.window.lowLimit;
              *pUVar2 = *pUVar2 - uVar19;
              pUVar2 = &(cctx->blockState).matchState.window.dictLimit;
              *pUVar2 = *pUVar2 - uVar19;
              ZSTD_reduceIndex(cctx,uVar19);
              uVar12 = (cctx->blockState).matchState.nextToUpdate;
              UVar11 = uVar12 - uVar19;
              if (uVar12 < uVar19) {
                UVar11 = 0;
              }
              (cctx->blockState).matchState.nextToUpdate = UVar11;
              (cctx->blockState).matchState.loadedDictEnd = 0;
              (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
            }
            uVar12 = iVar17 - *(int *)&(cctx->blockState).matchState.window.base;
            if ((cctx->blockState).matchState.loadedDictEnd + iVar9 < uVar12) {
              uVar12 = uVar12 - iVar9;
              if ((cctx->blockState).matchState.window.lowLimit < uVar12) {
                (cctx->blockState).matchState.window.lowLimit = uVar12;
              }
              uVar12 = (cctx->blockState).matchState.window.lowLimit;
              if ((cctx->blockState).matchState.window.dictLimit < uVar12) {
                (cctx->blockState).matchState.window.dictLimit = uVar12;
              }
              (cctx->blockState).matchState.loadedDictEnd = 0;
              (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
            }
            uVar12 = (cctx->blockState).matchState.window.lowLimit;
            if ((cctx->blockState).matchState.nextToUpdate < uVar12) {
              (cctx->blockState).matchState.nextToUpdate = uVar12;
            }
            sVar14 = ZSTD_compressBlock_internal
                               (cctx,(void *)((long)local_78 + 3),dstCapacity - 3,src,sVar16);
            if (sVar14 < 0xffffffffffffff89) {
              if (sVar14 == 0) {
                uVar15 = 0xffffffffffffffba;
                if (sVar16 + 3 <= dstCapacity) {
                  *local_78 = uVar23 + (short)sVar16 * 8;
                  *(char *)(local_78 + 1) = (char)(sVar16 >> 0xd);
                  memcpy((void *)((long)local_78 + 3),src,sVar16);
                  uVar15 = sVar16 + 3;
                }
                if (0xffffffffffffff88 < uVar15) {
                  bVar7 = false;
                  local_68 = uVar15;
                  goto LAB_00424fc6;
                }
              }
              else {
                *local_78 = uVar23 + 4 + (short)sVar14 * 8;
                *(char *)(local_78 + 1) = (char)(sVar14 >> 0xd);
                uVar15 = sVar14 + 3;
              }
              sVar20 = sVar20 - sVar16;
              local_78 = (short *)((long)local_78 + uVar15);
              dstCapacity = dstCapacity - uVar15;
              bVar7 = true;
              src = (void *)((long)src + sVar16);
            }
            else {
              bVar7 = false;
              local_68 = sVar14;
            }
          }
LAB_00424fc6:
        } while (bVar7);
      }
      sVar16 = local_68;
      if (local_68 < 0xffffffffffffff89) {
        uVar3 = cctx->consumedSrcSize;
        cctx->consumedSrcSize = uVar3 + srcSize;
        sVar13 = local_68 + sVar13;
        cctx->producedCSize = cctx->producedCSize + sVar13;
        sVar16 = 0xffffffffffffffb8;
        if (uVar3 + srcSize + 1 <= cctx->pledgedSrcSizePlusOne) {
          sVar16 = sVar13;
        }
        if (cctx->pledgedSrcSizePlusOne == 0) {
          sVar16 = sVar13;
        }
      }
    }
  }
  return sVar16;
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* const ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (unsigned)srcSize);
    if (cctx->stage==ZSTDcs_created) return ERROR(stage_wrong);   /* missing init (ZSTD_compressBegin) */

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        if (ZSTD_isError(fhSize)) return fhSize;
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize)) {
        ms->nextToUpdate = ms->window.dictLimit;
    }
    if (cctx->appliedParams.ldmParams.enableLdm) {
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize);
    }

    if (!frame) {
        /* overflow check and correction for block mode */
        if (ZSTD_window_needOverflowCorrection(ms->window, (const char*)src + srcSize)) {
            U32 const cycleLog = ZSTD_cycleLog(cctx->appliedParams.cParams.chainLog, cctx->appliedParams.cParams.strategy);
            U32 const correction = ZSTD_window_correctOverflow(&ms->window, cycleLog, 1 << cctx->appliedParams.cParams.windowLog, src);
            ZSTD_STATIC_ASSERT(ZSTD_CHAINLOG_MAX <= 30);
            ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX_32 <= 30);
            ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX <= 31);
            ZSTD_reduceIndex(cctx, correction);
            if (ms->nextToUpdate < correction) ms->nextToUpdate = 0;
            else ms->nextToUpdate -= correction;
            ms->loadedDictEnd = 0;
            ms->dictMatchState = NULL;
        }
    }

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (unsigned)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize);
        if (ZSTD_isError(cSize)) return cSize;
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            if (cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne) {
                DEBUGLOG(4, "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                    (unsigned)cctx->pledgedSrcSizePlusOne-1, (unsigned)cctx->consumedSrcSize);
                return ERROR(srcSize_wrong);
            }
        }
        return cSize + fhSize;
    }
}